

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peter.c
# Opt level: O3

int main(void)

{
  int iVar1;
  GLFWwindow *handle;
  
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 != 0) {
    handle = open_window();
    if (handle != (GLFWwindow *)0x0) {
      glClearColor(0,0,0,0);
      iVar1 = glfwWindowShouldClose(handle);
      do {
        if (iVar1 != 0) {
          glfwTerminate();
          exit(0);
        }
        glClear(0x4000);
        glfwSwapBuffers(handle);
        glfwWaitEvents();
        if (reopen == '\x01') {
          glfwDestroyWindow(handle);
          handle = open_window();
          if (handle == (GLFWwindow *)0x0) break;
          reopen = '\0';
        }
        fflush(_stdout);
        iVar1 = glfwWindowShouldClose(handle);
      } while( true );
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(void)
{
    GLFWwindow* window;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    window = open_window();
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glClearColor(0.f, 0.f, 0.f, 0.f);

    while (!glfwWindowShouldClose(window))
    {
        glClear(GL_COLOR_BUFFER_BIT);

        glfwSwapBuffers(window);
        glfwWaitEvents();

        if (reopen)
        {
            glfwDestroyWindow(window);
            window = open_window();
            if (!window)
            {
                glfwTerminate();
                exit(EXIT_FAILURE);
            }

            reopen = GL_FALSE;
        }

        // Workaround for an issue with msvcrt and mintty
        fflush(stdout);
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}